

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

int64_t __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::InNanosecondsFromNow
          (KernelTimeout *this)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long *plVar4;
  long local_40;
  long local_38 [3];
  long local_20;
  int64_t nanos;
  KernelTimeout *this_local;
  
  nanos = (int64_t)this;
  bVar2 = has_timeout(this);
  if (bVar2) {
    local_20 = RawAbsNanos(this);
    bVar2 = is_absolute_timeout(this);
    lVar1 = local_20;
    if (bVar2) {
      local_38[2] = absl::lts_20240722::GetCurrentTimeNanos();
      local_38[2] = lVar1 - local_38[2];
      local_38[1] = 0;
      plVar4 = std::max<long>(local_38 + 2,local_38 + 1);
      this_local = (KernelTimeout *)*plVar4;
    }
    else {
      iVar3 = SteadyClockNow();
      local_38[0] = lVar1 - iVar3;
      local_40 = 0;
      plVar4 = std::max<long>(local_38,&local_40);
      this_local = (KernelTimeout *)*plVar4;
    }
  }
  else {
    this_local = (KernelTimeout *)0x7fffffffffffffff;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t KernelTimeout::InNanosecondsFromNow() const {
  if (!has_timeout()) {
    return kMaxNanos;
  }

  int64_t nanos = RawAbsNanos();
  if (is_absolute_timeout()) {
    return std::max<int64_t>(nanos - absl::GetCurrentTimeNanos(), 0);
  }
  return std::max<int64_t>(nanos - SteadyClockNow(), 0);
}